

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int doremote(lua_State *L)

{
  lua_State *plVar1;
  int iVar2;
  char *pcVar3;
  int idx;
  int local_38;
  int local_34;
  int i;
  int status;
  char *code;
  size_t lcode;
  lua_State *L1;
  lua_State *L_local;
  
  L1 = L;
  lcode = (size_t)getstate(L);
  pcVar3 = luaL_checklstring(L1,2,(size_t *)&code);
  lua_settop((lua_State *)lcode,0);
  local_34 = luaL_loadbufferx((lua_State *)lcode,pcVar3,(size_t)code,pcVar3,(char *)0x0);
  if (local_34 == 0) {
    local_34 = lua_pcallk((lua_State *)lcode,0,-1,0,0,(lua_KFunction)0x0);
  }
  if (local_34 == 0) {
    local_38 = 0;
    while( true ) {
      idx = local_38 + 1;
      iVar2 = lua_type((lua_State *)lcode,idx);
      plVar1 = L1;
      if (iVar2 == -1) break;
      pcVar3 = lua_tolstring((lua_State *)lcode,idx,(size_t *)0x0);
      lua_pushstring(plVar1,pcVar3);
      local_38 = idx;
    }
    lua_settop((lua_State *)lcode,-1 - local_38);
    L_local._4_4_ = local_38;
  }
  else {
    lua_pushnil(L1);
    plVar1 = L1;
    pcVar3 = lua_tolstring((lua_State *)lcode,-1,(size_t *)0x0);
    lua_pushstring(plVar1,pcVar3);
    lua_pushinteger(L1,(long)local_34);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int doremote (lua_State *L) {
  lua_State *L1 = getstate(L);
  size_t lcode;
  const char *code = luaL_checklstring(L, 2, &lcode);
  int status;
  lua_settop(L1, 0);
  status = luaL_loadbuffer(L1, code, lcode, code);
  if (status == LUA_OK)
    status = lua_pcall(L1, 0, LUA_MULTRET, 0);
  if (status != LUA_OK) {
    lua_pushnil(L);
    lua_pushstring(L, lua_tostring(L1, -1));
    lua_pushinteger(L, status);
    return 3;
  }
  else {
    int i = 0;
    while (!lua_isnone(L1, ++i))
      lua_pushstring(L, lua_tostring(L1, i));
    lua_pop(L1, i-1);
    return i-1;
  }
}